

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

void __thiscall GoState<3U,_4U>::GoState(GoState<3U,_4U> *this,char (*board) [5])

{
  long in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  int j;
  int i;
  GoState<3U,_4U> state;
  long *plVar1;
  uint local_74;
  uint local_70;
  GoState<3U,_4U> *in_stack_ffffffffffffffd0;
  
  *in_RDI = (long)&PTR__GoState_001f0678;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  plVar1 = in_RDI + 3;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x1ab473);
  *(undefined4 *)(in_RDI + 9) = 0;
  *(undefined4 *)((long)in_RDI + 0x4c) = 1;
  GoState(in_stack_ffffffffffffffd0);
  for (local_70 = 0; local_70 < 3; local_70 = local_70 + 1) {
    for (local_74 = 0; local_74 < 4; local_74 = local_74 + 1) {
      if (*(char *)(in_RSI + (long)(int)local_70 * 5 + (long)(int)local_74) == '1') {
        (**(code **)(*in_RDI + 0x18))(in_RDI,local_70,local_74,1);
      }
      else if (*(char *)(in_RSI + (long)(int)local_70 * 5 + (long)(int)local_74) == '2') {
        (**(code **)(*in_RDI + 0x18))(in_RDI,local_70,local_74,2);
      }
      else {
        (**(code **)(*in_RDI + 0x18))(in_RDI,local_70,local_74,0,in_R8,in_R9,plVar1);
      }
    }
  }
  ~GoState((GoState<3U,_4U> *)0x1ab5b3);
  return;
}

Assistant:

GoState(char board[M][N+1]):
		previous_board_hash_value(0),
		depth(0),
		player_to_move(1)
	{
		GoState<M, N> state;
		for (int i = 0; i < M; ++i) {
		for (int j = 0; j < N; ++j) {
			if (board[i][j] == '1') {
				set_pos(i, j, 1);
			}
			else if (board[i][j] == '2') {
				set_pos(i, j, 2);
			}
			else {
				set_pos(i, j, empty);
			}
		}}
	}